

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom.cpp
# Opt level: O2

void __thiscall CBloomFilter::insert(CBloomFilter *this,COutPoint *outpoint)

{
  long in_FS_OFFSET;
  Span<const_unsigned_char> vKey;
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_38;
  long lStack_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lStack_20 = 0;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  COutPoint::SerializationOps<DataStream,COutPoint_const,ActionSerialize>(outpoint);
  vKey.m_data = local_38._M_impl.super__Vector_impl_data._M_start + lStack_20;
  vKey.m_size = (long)local_38._M_impl.super__Vector_impl_data._M_finish - (long)vKey.m_data;
  insert(this,vKey);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CBloomFilter::insert(const COutPoint& outpoint)
{
    DataStream stream{};
    stream << outpoint;
    insert(MakeUCharSpan(stream));
}